

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

bool __thiscall QAbstractSocket::waitForReadyRead(QAbstractSocket *this,int msecs)

{
  QAbstractSocketEngine *pQVar1;
  bool bVar2;
  byte bVar3;
  SocketState SVar4;
  QAbstractSocketPrivate *pQVar5;
  ulong uVar6;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractSocketPrivate *d;
  bool readyToWrite;
  bool readyToRead;
  QDeadlineTimer deadline;
  uint in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  SocketError in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool local_49;
  undefined4 local_30;
  uint uStack_28;
  uint uStack_24;
  byte local_1a;
  byte local_19;
  QDeadlineTimer local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QAbstractSocket *)0x253784);
  SVar4 = state((QAbstractSocket *)0x253793);
  if (SVar4 == UnconnectedState) {
    local_49 = false;
  }
  else {
    local_18.t1 = -0x5555555555555556;
    local_18.t2 = 0xaaaaaaaa;
    local_18.type = 0xaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer(&local_18,(long)in_ESI,CoarseTimer);
    SVar4 = state((QAbstractSocket *)0x2537e1);
    if (((SVar4 == HostLookupState) ||
        (SVar4 = state((QAbstractSocket *)0x2537f0), SVar4 == ConnectingState)) &&
       (uVar6 = (**(code **)(*in_RDI + 0x130))(in_RDI,in_ESI), (uVar6 & 1) == 0)) {
      local_49 = false;
    }
    else {
      do {
        SVar4 = state((QAbstractSocket *)0x253823);
        if ((SVar4 != ConnectedState) &&
           (SVar4 = state((QAbstractSocket *)0x253832), SVar4 != BoundState)) {
          local_49 = false;
          goto LAB_0025399f;
        }
        local_19 = 0;
        local_1a = 0;
        pQVar1 = pQVar5->socketEngine;
        bVar2 = QIODevicePrivate::QRingBufferRef::isEmpty
                          ((QRingBufferRef *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_30 = (undefined4)local_18.t1;
        uStack_28 = local_18.t2;
        uStack_24 = local_18.type;
        uVar6 = (**(code **)(*(long *)pQVar1 + 0x130))
                          (pQVar1,&local_19,&local_1a,1,(bVar2 ^ 0xffU) & 1,0,local_30);
        if ((uVar6 & 1) == 0) {
          QAbstractSocketEngine::error((QAbstractSocketEngine *)0x2538f2);
          QAbstractSocketEngine::errorString
                    ((QAbstractSocketEngine *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          QAbstractSocketPrivate::setErrorAndEmit
                    ((QAbstractSocketPrivate *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,(QString *)CONCAT44(uStack_24,uStack_28));
          QString::~QString((QString *)0x253929);
          if (pQVar5->socketError != SocketTimeoutError) {
            (**(code **)(*in_RDI + 0x70))();
          }
          local_49 = false;
          goto LAB_0025399f;
        }
        in_stack_ffffffffffffff60 = uStack_28;
        in_stack_ffffffffffffff64 = uStack_24;
        if (((local_19 & 1) != 0) &&
           (uVar6 = (**(code **)(*(long *)pQVar5 + 0x70))(), in_stack_ffffffffffffff60 = uStack_28,
           in_stack_ffffffffffffff64 = uStack_24, (uVar6 & 1) != 0)) {
          local_49 = true;
          goto LAB_0025399f;
        }
        if ((local_1a & 1) != 0) {
          QAbstractSocketPrivate::canWriteNotification((QAbstractSocketPrivate *)0x253981);
        }
        bVar3 = QDeadlineTimer::hasExpired();
      } while (((bVar3 ^ 0xff) & 1) != 0);
      local_49 = false;
    }
  }
LAB_0025399f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

bool QAbstractSocket::waitForReadyRead(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForReadyRead(%i)", msecs);
#endif

    // require calling connectToHost() before waitForReadyRead()
    if (state() == UnconnectedState) {
        /* If all you have is a QIODevice pointer to an abstractsocket, you cannot check
           this, so you cannot avoid this warning. */
//        qWarning("QAbstractSocket::waitForReadyRead() is not allowed in UnconnectedState");
        return false;
    }

    QDeadlineTimer deadline{msecs};

    // handle a socket in connecting state
    if (state() == HostLookupState || state() == ConnectingState) {
        if (!waitForConnected(msecs))
            return false;
    }

    do {
        if (state() != ConnectedState && state() != BoundState)
            return false;
        Q_ASSERT(d->socketEngine);

        bool readyToRead = false;
        bool readyToWrite = false;
        if (!d->socketEngine->waitForReadOrWrite(&readyToRead, &readyToWrite, true, !d->writeBuffer.isEmpty(),
                                                 deadline)) {
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocket::waitForReadyRead(%i) failed (%i, %s)",
                   msecs, d->socketEngine->error(), d->socketEngine->errorString().toLatin1().constData());
#endif
            d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
            if (d->socketError != SocketTimeoutError)
                close();
            return false;
        }

        if (readyToRead) {
            if (d->canReadNotification())
                return true;
        }

        if (readyToWrite)
            d->canWriteNotification();
    } while (!deadline.hasExpired());
    return false;
}